

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::PsbtList::PsbtList(PsbtList *this)

{
  PsbtList *this_local;
  
  core::JsonClassBase<cfd::js::api::json::PsbtList>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::PsbtList>);
  (this->super_JsonClassBase<cfd::js::api::json::PsbtList>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtList_01b48620;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->psbts_);
  CollectFieldName();
  return;
}

Assistant:

PsbtList() {
    CollectFieldName();
  }